

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster_test.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  int local_1c;
  MppNode pvStack_18;
  RK_U32 total_run;
  MppNode node;
  MPP_RET ret;
  
  node._4_4_ = 0;
  node._0_4_ = 0;
  pvStack_18 = test_node.node;
  local_1c = 2;
  _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test start\n",0);
  node._0_4_ = mpp_node_init(&stack0xffffffffffffffe8);
  if ((int)node == 0) {
    _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test init node done\n",0);
    mpp_node_set_func(pvStack_18,mpp_cluster_test_worker,&test_node);
    _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test attach node start\n",0);
    node._0_4_ = mpp_node_attach(pvStack_18,9);
    if ((int)node == 0) {
      _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test trigger start\n",0);
      do {
        node._0_4_ = mpp_node_trigger_f("main",pvStack_18,1);
        if ((int)node != 0) {
          _mpp_log_l(2,"mpp_cluster_test","mpp_node_trigger failed ret %d\n",0,(int)node);
          goto LAB_00101426;
        }
        _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test trigger %d left\n",0,local_1c);
        usleep(5000);
        local_1c = local_1c + -1;
      } while (local_1c != 0);
      _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test detach start\n",0);
      node._0_4_ = mpp_node_detach(pvStack_18);
      if ((int)node == 0) {
        _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test deinit start\n",0);
        node._0_4_ = mpp_node_deinit(pvStack_18);
        if ((int)node == 0) {
          _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test deinit done\n",0);
        }
        else {
          _mpp_log_l(2,"mpp_cluster_test","mpp_node_deinit failed ret %d\n",0,(int)node);
        }
      }
      else {
        _mpp_log_l(2,"mpp_cluster_test","mpp_node_detach failed ret %d\n",0,(int)node);
      }
    }
    else {
      _mpp_log_l(2,"mpp_cluster_test","mpp_node_attach failed ret %d\n",0,(int)node);
    }
  }
  else {
    _mpp_log_l(2,"mpp_cluster_test","mpp_node_init failed ret %d\n",0,(int)node);
  }
LAB_00101426:
  pcVar1 = "success";
  if ((int)node != 0) {
    pcVar1 = "failed";
  }
  _mpp_log_l(4,"mpp_cluster_test","mpp_cluster_test done %s\n",0,pcVar1);
  return (int)node;
}

Assistant:

int main()
{
    MPP_RET ret = MPP_OK;
    MppNode node = test_node.node;
    RK_U32 total_run = 2;

    mpp_log("mpp_cluster_test start\n");

    ret = mpp_node_init(&node);
    if (ret) {
        mpp_err("mpp_node_init failed ret %d\n", ret);
        goto DONE;
    }

    mpp_log("mpp_cluster_test init node done\n");

    /* setup node info */
    mpp_node_set_func(node, mpp_cluster_test_worker, &test_node);

    mpp_log("mpp_cluster_test attach node start\n");
    ret = mpp_node_attach(node, VPU_CLIENT_RKVDEC);
    if (ret) {
        mpp_err("mpp_node_attach failed ret %d\n", ret);
        goto DONE;
    }

    mpp_log("mpp_cluster_test trigger start\n");

    do {
        ret = mpp_node_trigger(node, 1);
        if (ret) {
            mpp_err("mpp_node_trigger failed ret %d\n", ret);
            goto DONE;
        }

        mpp_log("mpp_cluster_test trigger %d left\n", total_run);

        msleep(5);
    } while (--total_run);

    mpp_log("mpp_cluster_test detach start\n");

    ret = mpp_node_detach(node);
    if (ret) {
        mpp_err("mpp_node_detach failed ret %d\n", ret);
        goto DONE;
    }

    mpp_log("mpp_cluster_test deinit start\n");

    ret = mpp_node_deinit(node);
    if (ret) {
        mpp_err("mpp_node_deinit failed ret %d\n", ret);
        goto DONE;
    }

    mpp_log("mpp_cluster_test deinit done\n");

DONE:
    mpp_log("mpp_cluster_test done %s\n", ret ? "failed" : "success");
    return ret;
}